

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O0

char (*) [15]
toml::format<char_const*,char_const(&)[6],char_const*,char_const(&)[15]>
          (stringstream *ss,char **t,char (*args) [6],char **args_1,char (*args_2) [15])

{
  undefined8 *in_RDX;
  long in_RSI;
  char (*in_RDI) [15];
  stringstream *in_R8;
  char (*in_R9) [6];
  char (*args_00) [15];
  
  args_00 = in_RDI;
  std::operator<<((ostream *)(in_RSI + 0x10),(char *)*in_RDX);
  format<char_const(&)[6],char_const*,char_const(&)[15]>(in_R8,in_R9,(char **)args_00,in_RDI);
  return args_00;
}

Assistant:

std::string format(std::stringstream& ss, T&& t, Args&&... args)
{
    ss << std::forward<T>(t);
    return format(ss, std::forward<Args>(args)...);
}